

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.h
# Opt level: O3

void __thiscall
Iir::CascadeStages<2,_Iir::DirectFormI>::setup
          (CascadeStages<2,_Iir::DirectFormI> *this,double (*sosCoefficients) [2] [6])

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    Biquad::setCoefficients
              (this->m_stages + lVar2,(*sosCoefficients)[lVar2][3],(*sosCoefficients)[lVar2][4],
               (*sosCoefficients)[lVar2][5],(*sosCoefficients)[lVar2][0],
               (*sosCoefficients)[lVar2][1],(*sosCoefficients)[lVar2][2]);
    lVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void setup (const double (&sosCoefficients)[MaxStages][6]) {
                for (int i = 0; i < MaxStages; i++) {
                        m_stages[i].setCoefficients(
                                sosCoefficients[i][3],
                                sosCoefficients[i][4],
                                sosCoefficients[i][5],
                                sosCoefficients[i][0],
                                sosCoefficients[i][1],
                                sosCoefficients[i][2]);
                }
        }